

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O0

void av1_nn_predict_sse3(float *input_nodes,NN_CONFIG *nn_config,int reduce_prec,float *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __m128 *pafVar3;
  __m128 *pafVar4;
  float *pfVar5;
  float *in_RCX;
  int in_EDX;
  int *in_RSI;
  float *in_RDI;
  __m128 weight;
  __m128 input;
  int in_node;
  __m128 total_2;
  int out_5;
  int in_4;
  __m128 total_1;
  int out_4;
  int in_3;
  __m128 total;
  int out_3;
  int in_2;
  __m128 outputs_1;
  int out_2;
  int in_1;
  __m128 outputs;
  int out_1;
  int in;
  __m128 out_l;
  __m128 out_h;
  int out;
  int num_outputs;
  float *output_nodes;
  _Bool output_layer;
  float *layer_bias;
  float *layer_weights;
  int layer;
  int num_inputs;
  int buf_index;
  float buf [2] [128];
  int local_714;
  float *local_710;
  __m128 *in_stack_fffffffffffff8f8;
  __m128 *in_stack_fffffffffffff900;
  float *in_stack_fffffffffffff908;
  float *in_stack_fffffffffffff910;
  int in_stack_fffffffffffff924;
  __m128 *in_stack_fffffffffffff928;
  __m128 *in_stack_fffffffffffff930;
  float *in_stack_fffffffffffff938;
  int in_stack_fffffffffffff940;
  int in_stack_fffffffffffff944;
  __m128 *in_stack_fffffffffffff948;
  float *in_stack_fffffffffffff950;
  float *in_stack_fffffffffffff958;
  int local_6a0;
  int local_69c;
  float local_698 [2];
  float afStack_690 [4];
  int local_680;
  int local_67c;
  float local_678 [2];
  float afStack_670 [4];
  int local_660;
  int local_65c;
  float local_658 [2];
  float afStack_650 [4];
  int local_640;
  int local_63c;
  float local_638 [2];
  float afStack_630 [2];
  float local_628 [2];
  float afStack_620 [4];
  int local_610;
  int local_60c;
  float *local_608;
  byte local_5f9;
  long local_5f8;
  long local_5f0;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  float local_5d8 [256];
  float *local_1d8;
  int local_1cc;
  int *local_1c8;
  float *local_1c0;
  float *local_1b8;
  float *local_1b0;
  float *local_1a8;
  float *local_1a0;
  __m128 *local_198;
  __m128 *pafStack_190;
  float *local_188;
  float *pfStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158 [2];
  float afStack_150 [4];
  float *local_140;
  float local_138 [2];
  float afStack_130 [4];
  float *local_120;
  float local_118 [2];
  float afStack_110 [4];
  float *local_100;
  float local_f8 [2];
  float afStack_f0 [4];
  float *local_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float *pfStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a4;
  float *local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 *puStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 *puStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float *pfStack_40;
  __m128 *local_38;
  __m128 *pafStack_30;
  __m128 *local_28;
  float *pfStack_20;
  float local_18 [2];
  float afStack_10 [4];
  
  local_5dc = 0;
  local_5e0 = *in_RSI;
  local_1d8 = in_RCX;
  local_1cc = in_EDX;
  local_1c8 = in_RSI;
  local_1c0 = in_RDI;
  for (local_5e4 = 0; local_5e4 <= local_1c8[2]; local_5e4 = local_5e4 + 1) {
    local_5f0 = *(long *)(local_1c8 + (long)local_5e4 * 2 + 0xe);
    local_5f8 = *(long *)(local_1c8 + (long)local_5e4 * 2 + 0x24);
    local_5f9 = local_5e4 == local_1c8[2];
    if ((bool)local_5f9) {
      local_710 = local_1d8;
    }
    else {
      local_710 = local_5d8 + (long)local_5dc * 0x80;
    }
    local_608 = local_710;
    if ((bool)local_5f9) {
      local_714 = local_1c8[1];
    }
    else {
      local_714 = local_1c8[(long)local_5e4 + 3];
    }
    local_60c = local_714;
    if ((local_5e0 % 4 == 0) && (local_714 % 8 == 0)) {
      for (local_610 = 0; local_610 < local_60c; local_610 = local_610 + 8) {
        local_1a0 = (float *)(local_5f8 + (long)(local_610 + 4) * 4);
        local_628 = *(float (*) [2])local_1a0;
        afStack_620._0_8_ = *(undefined8 *)(local_1a0 + 2);
        local_1a8 = (float *)(local_5f8 + (long)local_610 * 4);
        local_638 = *(float (*) [2])local_1a8;
        afStack_630 = *(float (*) [2])(local_1a8 + 2);
        for (local_63c = 0; local_63c < local_5e0; local_63c = local_63c + 4) {
          av1_nn_propagate_4to8_sse3
                    ((float *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                     in_stack_fffffffffffff938,in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                     in_stack_fffffffffffff924);
        }
        if ((local_5f9 & 1) == 0) {
          nn_activate8((__m128 *)local_628,(__m128 *)local_638);
        }
        pfVar5 = local_608 + (local_610 + 4);
        local_f8[0] = local_628[0];
        local_f8[1] = local_628[1];
        afStack_f0[0] = afStack_620[0];
        afStack_f0[1] = afStack_620[1];
        local_e0 = pfVar5;
        *(float (*) [2])pfVar5 = local_628;
        *(undefined8 *)(pfVar5 + 2) = afStack_620._0_8_;
        pfVar5 = local_608 + local_610;
        local_118[0] = local_638[0];
        local_118[1] = local_638[1];
        afStack_110[0] = afStack_630[0];
        afStack_110[1] = afStack_630[1];
        local_100 = pfVar5;
        *(float (*) [2])pfVar5 = local_638;
        *(float (*) [2])(pfVar5 + 2) = afStack_630;
      }
    }
    else if ((local_5e0 % 8 == 0) && (local_714 % 4 == 0)) {
      for (local_640 = 0; local_640 < local_60c; local_640 = local_640 + 4) {
        local_1b0 = (float *)(local_5f8 + (long)local_640 * 4);
        local_658 = *(float (*) [2])local_1b0;
        afStack_650._0_8_ = *(undefined8 *)(local_1b0 + 2);
        for (local_65c = 0; local_65c < local_5e0; local_65c = local_65c + 8) {
          nn_propagate_8to4(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                            in_stack_fffffffffffff948,in_stack_fffffffffffff944);
        }
        if ((local_5f9 & 1) == 0) {
          nn_activate4((__m128 *)local_658);
        }
        pfVar5 = local_608 + local_640;
        local_138[0] = local_658[0];
        local_138[1] = local_658[1];
        afStack_130[0] = afStack_650[0];
        afStack_130[1] = afStack_650[1];
        local_120 = pfVar5;
        *(float (*) [2])pfVar5 = local_658;
        *(undefined8 *)(pfVar5 + 2) = afStack_650._0_8_;
      }
    }
    else if ((local_5e0 % 4 == 0) && (local_714 % 4 == 0)) {
      for (local_660 = 0; local_660 < local_60c; local_660 = local_660 + 4) {
        local_1b8 = (float *)(local_5f8 + (long)local_660 * 4);
        local_678 = *(float (*) [2])local_1b8;
        afStack_670._0_8_ = *(undefined8 *)(local_1b8 + 2);
        for (local_67c = 0; local_67c < local_5e0; local_67c = local_67c + 4) {
          av1_nn_propagate_4to4_sse3
                    (in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900,
                     (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20));
        }
        if ((local_5f9 & 1) == 0) {
          nn_activate4((__m128 *)local_678);
        }
        pfVar5 = local_608 + local_660;
        local_158[0] = local_678[0];
        local_158[1] = local_678[1];
        afStack_150[0] = afStack_670[0];
        afStack_150[1] = afStack_670[1];
        local_140 = pfVar5;
        *(float (*) [2])pfVar5 = local_678;
        *(undefined8 *)(pfVar5 + 2) = afStack_670._0_8_;
      }
    }
    else if (local_5e0 % 8 == 0) {
      for (local_680 = 0; local_680 < local_60c; local_680 = local_680 + 1) {
        pfStack_40 = (float *)(local_5f8 + (long)local_680 * 4);
        local_58 = *pfStack_40;
        local_698[1] = local_58;
        local_698[0] = local_58;
        afStack_690[1] = local_58;
        afStack_690[0] = local_58;
        fStack_54 = local_58;
        fStack_50 = local_58;
        fStack_4c = local_58;
        local_48 = local_58;
        for (local_69c = 0; local_69c < local_5e0; local_69c = local_69c + 8) {
          nn_propagate_8to1(in_stack_fffffffffffff908,*in_stack_fffffffffffff900,
                            in_stack_fffffffffffff8f8);
        }
        if ((local_5f9 & 1) == 0) {
          nn_activate4((__m128 *)local_698);
        }
        uVar1._0_4_ = local_698[0];
        uVar1._4_4_ = local_698[1];
        uVar2._0_4_ = afStack_690[0];
        uVar2._4_4_ = afStack_690[1];
        local_18[0] = local_698[0];
        local_608[local_680] = local_18[0];
        local_18 = (float  [2])uVar1;
        afStack_10._0_8_ = uVar2;
      }
    }
    else if (local_5e0 % 4 == 0) {
      for (local_6a0 = 0; local_6a0 < local_60c; local_6a0 = local_6a0 + 1) {
        puStack_60 = (undefined4 *)(local_5f8 + (long)local_6a0 * 4);
        local_78 = *puStack_60;
        in_stack_fffffffffffff948 = (__m128 *)CONCAT44(local_78,local_78);
        in_stack_fffffffffffff950 = (float *)CONCAT44(local_78,local_78);
        uStack_74 = local_78;
        uStack_70 = local_78;
        uStack_6c = local_78;
        local_68 = local_78;
        for (in_stack_fffffffffffff944 = 0; in_stack_fffffffffffff944 < local_5e0;
            in_stack_fffffffffffff944 = in_stack_fffffffffffff944 + 4) {
          av1_nn_propagate_4to1_sse3
                    (local_1c0 + in_stack_fffffffffffff944,
                     (float *)(local_5f0 +
                              (long)(local_6a0 * local_5e0 + in_stack_fffffffffffff944) * 4),
                     (__m128 *)&stack0xfffffffffffff948);
        }
        if ((local_5f9 & 1) == 0) {
          nn_activate4((__m128 *)&stack0xfffffffffffff948);
        }
        local_28._0_4_ = SUB84(in_stack_fffffffffffff948,0);
        local_608[local_6a0] = local_28._0_4_;
        local_28 = in_stack_fffffffffffff948;
        pfStack_20 = in_stack_fffffffffffff950;
      }
    }
    else {
      for (in_stack_fffffffffffff940 = 0; in_stack_fffffffffffff940 < local_60c;
          in_stack_fffffffffffff940 = in_stack_fffffffffffff940 + 1) {
        puStack_80 = (undefined4 *)(local_5f8 + (long)in_stack_fffffffffffff940 * 4);
        local_98 = *puStack_80;
        pafVar3 = (__m128 *)CONCAT44(local_98,local_98);
        pafVar4 = (__m128 *)CONCAT44(local_98,local_98);
        for (in_stack_fffffffffffff924 = 0; in_stack_fffffffffffff930 = pafVar4,
            in_stack_fffffffffffff928 = pafVar3, in_stack_fffffffffffff924 < local_5e0;
            in_stack_fffffffffffff924 = in_stack_fffffffffffff924 + 1) {
          local_a0 = local_1c0 + in_stack_fffffffffffff924;
          local_b8 = *local_a0;
          in_stack_fffffffffffff908 = (float *)CONCAT44(local_b8,local_b8);
          in_stack_fffffffffffff910 = (float *)CONCAT44(local_b8,local_b8);
          pfStack_c0 = (float *)(local_5f0 +
                                (long)(local_5e0 * in_stack_fffffffffffff940 +
                                      in_stack_fffffffffffff924) * 4);
          local_d8 = *pfStack_c0;
          in_stack_fffffffffffff8f8 = (__m128 *)CONCAT44(local_d8,local_d8);
          in_stack_fffffffffffff900 = (__m128 *)CONCAT44(local_d8,local_d8);
          local_178 = local_b8 * local_d8;
          fStack_174 = local_b8 * local_d8;
          fStack_170 = local_b8 * local_d8;
          fStack_16c = local_b8 * local_d8;
          local_168._0_4_ = SUB84(in_stack_fffffffffffff928,0);
          local_168._4_4_ = (float)((ulong)in_stack_fffffffffffff928 >> 0x20);
          uStack_160._0_4_ = SUB84(in_stack_fffffffffffff930,0);
          uStack_160._4_4_ = (float)((ulong)in_stack_fffffffffffff930 >> 0x20);
          pafVar3 = (__m128 *)CONCAT44(local_168._4_4_ + fStack_174,(float)local_168 + local_178);
          pafVar4 = (__m128 *)CONCAT44(uStack_160._4_4_ + fStack_16c,(float)uStack_160 + fStack_170)
          ;
          local_198 = in_stack_fffffffffffff8f8;
          pafStack_190 = in_stack_fffffffffffff900;
          local_188 = in_stack_fffffffffffff908;
          pfStack_180 = in_stack_fffffffffffff910;
          local_168 = in_stack_fffffffffffff928;
          uStack_160 = in_stack_fffffffffffff930;
          fStack_d4 = local_d8;
          fStack_d0 = local_d8;
          fStack_cc = local_d8;
          local_c8 = local_d8;
          fStack_b4 = local_b8;
          fStack_b0 = local_b8;
          fStack_ac = local_b8;
          local_a4 = local_b8;
        }
        uStack_94 = local_98;
        uStack_90 = local_98;
        uStack_8c = local_98;
        local_88 = local_98;
        if ((local_5f9 & 1) == 0) {
          nn_activate4((__m128 *)&stack0xfffffffffffff928);
        }
        local_38._0_4_ = SUB84(in_stack_fffffffffffff928,0);
        local_608[in_stack_fffffffffffff940] = local_38._0_4_;
        local_38 = in_stack_fffffffffffff928;
        pafStack_30 = in_stack_fffffffffffff930;
      }
    }
    local_1c0 = local_608;
    local_5e0 = local_60c;
    local_5dc = 1 - local_5dc;
  }
  if (local_1cc != 0) {
    av1_nn_output_prec_reduce(local_1d8,local_1c8[1]);
  }
  return;
}

Assistant:

void av1_nn_predict_sse3(const float *input_nodes,
                         const NN_CONFIG *const nn_config, int reduce_prec,
                         float *const output) {
  float buf[2][NN_MAX_NODES_PER_LAYER];
  int buf_index = 0;
  int num_inputs = nn_config->num_inputs;

  // Hidden layers, except the final iteration is the output layer.
  for (int layer = 0; layer <= nn_config->num_hidden_layers; layer++) {
    const float *layer_weights = nn_config->weights[layer];
    const float *layer_bias = nn_config->bias[layer];
    bool output_layer = (layer == nn_config->num_hidden_layers);
    float *const output_nodes = output_layer ? output : &buf[buf_index][0];
    const int num_outputs = output_layer ? nn_config->num_outputs
                                         : nn_config->num_hidden_nodes[layer];

    if (num_inputs % 4 == 0 && num_outputs % 8 == 0) {
      for (int out = 0; out < num_outputs; out += 8) {
        __m128 out_h = _mm_loadu_ps(&layer_bias[out + 4]);
        __m128 out_l = _mm_loadu_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 4) {
          av1_nn_propagate_4to8_sse3(&input_nodes[in],
                                     &layer_weights[out * num_inputs + in],
                                     &out_h, &out_l, num_inputs);
        }
        if (!output_layer) nn_activate8(&out_h, &out_l);
        _mm_storeu_ps(&output_nodes[out + 4], out_h);
        _mm_storeu_ps(&output_nodes[out], out_l);
      }
    } else if (num_inputs % 8 == 0 && num_outputs % 4 == 0) {
      for (int out = 0; out < num_outputs; out += 4) {
        __m128 outputs = _mm_loadu_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 8) {
          nn_propagate_8to4(&input_nodes[in],
                            &layer_weights[out * num_inputs + in], &outputs,
                            num_inputs);
        }
        if (!output_layer) nn_activate4(&outputs);
        _mm_storeu_ps(&output_nodes[out], outputs);
      }
    } else if (num_inputs % 4 == 0 && num_outputs % 4 == 0) {
      for (int out = 0; out < num_outputs; out += 4) {
        __m128 outputs = _mm_loadu_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 4) {
          av1_nn_propagate_4to4_sse3(&input_nodes[in],
                                     &layer_weights[out * num_inputs + in],
                                     &outputs, num_inputs);
        }
        if (!output_layer) nn_activate4(&outputs);
        _mm_storeu_ps(&output_nodes[out], outputs);
      }
    } else if (num_inputs % 8 == 0) {
      for (int out = 0; out < num_outputs; out++) {
        __m128 total = _mm_load1_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 8) {
          nn_propagate_8to1(&input_nodes[in],
                            &layer_weights[out * num_inputs + in], &total);
        }
        if (!output_layer) nn_activate4(&total);
        output_nodes[out] = _mm_cvtss_f32(total);
      }
    } else if (num_inputs % 4 == 0) {
      for (int out = 0; out < num_outputs; out++) {
        __m128 total = _mm_load1_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 4) {
          av1_nn_propagate_4to1_sse3(
              &input_nodes[in], &layer_weights[out * num_inputs + in], &total);
        }
        if (!output_layer) nn_activate4(&total);
        output_nodes[out] = _mm_cvtss_f32(total);
      }
    } else {
      // Use SSE instructions for scalar operations to avoid the latency of
      // swapping between SIMD and FPU modes.
      for (int out = 0; out < num_outputs; out++) {
        __m128 total = _mm_load1_ps(&layer_bias[out]);
        for (int in_node = 0; in_node < num_inputs; in_node++) {
          __m128 input = _mm_load1_ps(&input_nodes[in_node]);
          __m128 weight =
              _mm_load1_ps(&layer_weights[num_inputs * out + in_node]);
          total = _mm_add_ps(total, _mm_mul_ps(input, weight));
        }
        if (!output_layer) nn_activate4(&total);
        output_nodes[out] = _mm_cvtss_f32(total);
      }
    }
    input_nodes = output_nodes;
    num_inputs = num_outputs;
    buf_index = 1 - buf_index;
  }
  if (reduce_prec) av1_nn_output_prec_reduce(output, nn_config->num_outputs);
}